

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O1

void __thiscall
slang::parsing::Preprocessor::applyDiagnosticPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> this_00;
  SyntaxNode *this_01;
  int iVar1;
  ulong uVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  Diagnostic *this_02;
  SourceLocation SVar4;
  char *pcVar5;
  size_t sVar6;
  byte *pbVar7;
  ulong uVar8;
  SyntaxNode *this_03;
  SourceManager *pSVar9;
  long lVar10;
  ulong uVar11;
  size_type __rlen;
  SyntaxNode *pSVar12;
  string_view sVar13;
  SourceRange SVar14;
  Token last;
  DiagnosticSeverity local_64;
  Token local_40;
  
  sVar6 = (pragma->args).elements._M_extent._M_extent_value;
  if (sVar6 == 0) {
    local_40 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)pragma);
    SVar4 = Token::location(&local_40);
    sVar13 = Token::rawText(&local_40);
    addDiag(this,(DiagCode)0x1d0004,(SourceLocation)((long)SVar4 + sVar13._M_len * 0x10000000));
  }
  else {
    uVar2 = sVar6 + 1;
    if (1 < uVar2) {
      uVar11 = 0;
      do {
        ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((pragma->args).elements._M_ptr + uVar11 * 2));
        this_03 = *ppSVar3;
        if (this_03->kind == NameValuePragmaExpression) {
          sVar13 = Token::valueText((Token *)(this_03 + 1));
          pcVar5 = sVar13._M_str;
          sVar6 = sVar13._M_len;
          if (sVar6 == 4) {
            iVar1 = bcmp(pcVar5,"warn",4);
            if (iVar1 != 0) {
LAB_00211661:
              SVar14 = Token::range((Token *)(this_03 + 1));
              addDiag(this,(DiagCode)0x1e0004,SVar14);
              goto LAB_00211720;
            }
            local_64 = Warning;
          }
          else if (sVar6 == 5) {
            iVar1 = bcmp(pcVar5,"error",5);
            if (iVar1 == 0) {
              local_64 = Error;
            }
            else {
              iVar1 = bcmp(pcVar5,"fatal",5);
              if (iVar1 != 0) goto LAB_00211661;
              local_64 = Fatal;
            }
          }
          else {
            if ((sVar6 != 6) || (iVar1 = bcmp(pcVar5,"ignore",6), iVar1 != 0)) goto LAB_00211661;
            local_64 = Ignored;
          }
          this_03 = this_03[2].parent;
          if (this_03->kind == SimplePragmaExpression) {
            pSVar12 = this_03 + 1;
            if ((short)this_03[1].kind != AcceptOnPropertyExpr) {
              SVar14 = Token::range((Token *)pSVar12);
              goto LAB_0021168e;
            }
            pSVar9 = this->sourceManager;
            SVar4 = Token::location((Token *)pSVar12);
            sVar13 = Token::valueText((Token *)pSVar12);
            SourceManager::addDiagnosticDirective(pSVar9,SVar4,sVar13,local_64);
          }
          else {
            if (this_03->kind != ParenPragmaExpression) goto LAB_00211689;
            pbVar7 = (byte *)((long)&(this_03[3].previewNode)->kind + 1);
            if ((byte *)0x1 < pbVar7) {
              uVar8 = (ulong)pbVar7 >> 1;
              lVar10 = 0;
              do {
                ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                    ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      *)((long)&(this_03[3].parent)->kind + lVar10));
                pSVar12 = *ppSVar3;
                if (pSVar12->kind == SimplePragmaExpression) {
                  this_01 = pSVar12 + 1;
                  if ((short)pSVar12[1].kind == AcceptOnPropertyExpr) {
                    pSVar9 = this->sourceManager;
                    SVar4 = Token::location((Token *)this_01);
                    sVar13 = Token::valueText((Token *)this_01);
                    SourceManager::addDiagnosticDirective(pSVar9,SVar4,sVar13,local_64);
                  }
                  else {
                    SVar14 = Token::range((Token *)this_01);
                    addDiag(this,(DiagCode)0x1d0004,SVar14);
                  }
                }
                else {
                  SVar14 = slang::syntax::SyntaxNode::sourceRange(pSVar12);
                  addDiag(this,(DiagCode)0x1d0004,SVar14);
                }
                lVar10 = lVar10 + 0x30;
                uVar8 = uVar8 - 1;
              } while (uVar8 != 0);
            }
          }
        }
        else if (this_03->kind == SimplePragmaExpression) {
          this_00 = this_03 + 1;
          sVar13 = Token::rawText((Token *)this_00);
          if ((short)this_03[1].kind == TokenList) {
            if ((sVar13._M_len == 4) && (iVar1 = bcmp(sVar13._M_str,"push",4), iVar1 == 0)) {
              pSVar9 = this->sourceManager;
              SVar4 = Token::location((Token *)this_00);
              sVar6 = 8;
              pcVar5 = "__push__";
            }
            else {
              if ((sVar13._M_len != 3) || (iVar1 = bcmp(sVar13._M_str,"pop",3), iVar1 != 0))
              goto LAB_0021158e;
              pSVar9 = this->sourceManager;
              SVar4 = Token::location((Token *)this_00);
              sVar6 = 7;
              pcVar5 = "__pop__";
            }
            sVar13._M_str = pcVar5;
            sVar13._M_len = sVar6;
            SourceManager::addDiagnosticDirective(pSVar9,SVar4,sVar13,Ignored);
          }
          else {
LAB_0021158e:
            SVar14 = Token::range((Token *)this_00);
            this_02 = addDiag(this,(DiagCode)0x2a0004,SVar14);
            Diagnostic::operator<<(this_02,sVar13);
          }
        }
        else {
LAB_00211689:
          SVar14 = slang::syntax::SyntaxNode::sourceRange(this_03);
LAB_0021168e:
          addDiag(this,(DiagCode)0x1d0004,SVar14);
        }
LAB_00211720:
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar2 >> 1);
    }
  }
  return;
}

Assistant:

void Preprocessor::applyDiagnosticPragma(const PragmaDirectiveSyntax& pragma) {
    if (pragma.args.empty()) {
        Token last = pragma.getLastToken();
        addDiag(diag::ExpectedDiagPragmaArg, last.location() + last.rawText().length());
        return;
    }

    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            std::string_view action = simple.value.rawText();
            if (simple.value.kind == TokenKind::Identifier && action == "push") {
                sourceManager.addDiagnosticDirective(simple.value.location(), "__push__",
                                                     DiagnosticSeverity::Ignored);
            }
            else if (simple.value.kind == TokenKind::Identifier && action == "pop") {
                sourceManager.addDiagnosticDirective(simple.value.location(), "__pop__",
                                                     DiagnosticSeverity::Ignored);
            }
            else {
                addDiag(diag::UnknownDiagPragmaArg, simple.value.range()) << action;
            }
        }
        else if (arg->kind == SyntaxKind::NameValuePragmaExpression) {
            auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();

            DiagnosticSeverity severity;
            std::string_view text = nvp.name.valueText();
            if (text == "ignore")
                severity = DiagnosticSeverity::Ignored;
            else if (text == "warn")
                severity = DiagnosticSeverity::Warning;
            else if (text == "error")
                severity = DiagnosticSeverity::Error;
            else if (text == "fatal")
                severity = DiagnosticSeverity::Fatal;
            else {
                addDiag(diag::ExpectedDiagPragmaLevel, nvp.name.range());
                continue;
            }

            auto setDirective = [&](const PragmaExpressionSyntax& expr) {
                if (expr.kind == SyntaxKind::SimplePragmaExpression) {
                    auto& simple = expr.as<SimplePragmaExpressionSyntax>();
                    if (simple.value.kind == TokenKind::StringLiteral) {
                        sourceManager.addDiagnosticDirective(simple.value.location(),
                                                             simple.value.valueText(), severity);
                    }
                    else {
                        addDiag(diag::ExpectedDiagPragmaArg, simple.value.range());
                    }
                }
                else {
                    addDiag(diag::ExpectedDiagPragmaArg, expr.sourceRange());
                }
            };

            if (nvp.value->kind == SyntaxKind::ParenPragmaExpression) {
                auto& paren = nvp.value->as<ParenPragmaExpressionSyntax>();
                for (auto value : paren.values)
                    setDirective(*value);
            }
            else {
                setDirective(*nvp.value);
            }
        }
        else {
            addDiag(diag::ExpectedDiagPragmaArg, arg->sourceRange());
        }
    }
}